

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManPatSatImprove(Gia_Man_t *p,int nWords0,int fVerbose)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  uint nCexes;
  Vec_Str_t *__ptr;
  Vec_Wrd_t *vSims;
  Gia_Man_t *pAig;
  Vec_Int_t *vCexStore;
  Vec_Wrd_t *pVVar4;
  long lVar5;
  Vec_Wrd_t *__ptr_00;
  int Counts [3];
  Vec_Str_t *vStatus;
  undefined8 local_48;
  int local_40;
  Vec_Str_t *local_38;
  
  local_48 = 0;
  local_40 = 0;
  local_38 = (Vec_Str_t *)0x0;
  vSims = Gia_ManSimPatSim(p);
  pAig = Gia_ManSimPatGenMiter(p,vSims);
  vCexStore = Cbs2_ManSolveMiterNc(pAig,1000,&local_38,0);
  Gia_ManStop(pAig);
  iVar2 = local_38->nSize;
  if (0 < (long)iVar2) {
    pcVar3 = local_38->pArray;
    lVar5 = 0;
    do {
      if (2 < (byte)(pcVar3[lVar5] + 1U)) {
        __assert_fail("Status >= -1 && Status <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x1ad,"void Gia_ManPatSatImprove(Gia_Man_t *, int, int)");
      }
      piVar1 = (int *)((long)&local_48 + (long)pcVar3[lVar5] * 4 + 4);
      *piVar1 = *piVar1 + 1;
      lVar5 = lVar5 + 1;
    } while (iVar2 != lVar5);
  }
  nCexes = local_48._4_4_;
  if (fVerbose != 0) {
    printf("Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n",
           (ulong)(local_40 + local_48._4_4_ + (int)local_48),(ulong)local_48._4_4_);
  }
  if (nCexes == 0) {
    puts("There are no counter-examples.  No need for more simulation.");
    goto LAB_007d34f6;
  }
  pVVar4 = Gia_ManSimBitPacking(p,vCexStore,nCexes,(int)local_48);
  __ptr_00 = p->vSimsPi;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vSimsPi->pArray = (word *)0x0;
      __ptr_00 = p->vSimsPi;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) goto LAB_007d34e1;
    }
    free(__ptr_00);
  }
LAB_007d34e1:
  p->vSimsPi = pVVar4;
LAB_007d34f6:
  __ptr = local_38;
  if (local_38->pArray != (char *)0x0) {
    free(local_38->pArray);
  }
  free(__ptr);
  if (vCexStore->pArray != (int *)0x0) {
    free(vCexStore->pArray);
  }
  free(vCexStore);
  if (vSims->pArray != (word *)0x0) {
    free(vSims->pArray);
  }
  free(vSims);
  return;
}

Assistant:

void Gia_ManPatSatImprove( Gia_Man_t * p, int nWords0, int fVerbose )
{
    extern Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose );
    int i, Status, Counts[3] = {0};
    Gia_Man_t * pGia;
    Vec_Wrd_t * vSimsIn = NULL;
    Vec_Str_t * vStatus = NULL;
    Vec_Int_t * vCexStore = NULL;
    Vec_Wrd_t * vSims = Gia_ManSimPatSim( p );
    //Gia_ManSimProfile( p );
    pGia  = Gia_ManSimPatGenMiter( p, vSims );
    vCexStore = Cbs2_ManSolveMiterNc( pGia, 1000, &vStatus, 0 );
    Gia_ManStop( pGia );
    Vec_StrForEachEntry( vStatus, Status, i )
    {
        assert( Status >= -1 && Status <= 1 );
        Counts[Status+1]++;
    }
    if ( fVerbose )
        printf( "Total = %d : SAT = %d.  UNSAT = %d.  UNDEC = %d.\n", Counts[1]+Counts[2]+Counts[0], Counts[1], Counts[2], Counts[0] );
    if ( Counts[1] == 0 )
        printf( "There are no counter-examples.  No need for more simulation.\n" );
    else
    {
        vSimsIn = Gia_ManSimBitPacking( p, vCexStore, Counts[1], Counts[0] );
        Vec_WrdFreeP( &p->vSimsPi );
        p->vSimsPi = vSimsIn;
        //Gia_ManSimProfile( p );
    }
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
    Vec_WrdFree( vSims );
}